

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::binary_go<unsigned_char,float>
          (Opers t_oper,uchar *t,float *u,Boxed_Value *t_lhs)

{
  undefined8 uVar1;
  float *in_RCX;
  bad_any_cast *this;
  byte *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffffb8;
  element_type *peVar3;
  
  this = (bad_any_cast *)(ulong)(in_ESI - 8);
  peVar3 = in_RDI;
  switch(this) {
  case (bad_any_cast *)0x0:
    *in_RDX = (byte)(int)*in_RCX;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this);
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  case (bad_any_cast *)0x3:
    *in_RDX = (byte)(int)((float)*in_RDX * *in_RCX);
    break;
  case (bad_any_cast *)0x4:
    *in_RDX = (byte)(int)((float)*in_RDX + *in_RCX);
    break;
  case (bad_any_cast *)0x5:
    check_divide_by_zero<float>(*in_RCX,(type *)0x0);
    *in_RDX = (byte)(int)((float)*in_RDX / *in_RCX);
    break;
  case (bad_any_cast *)0x6:
    *in_RDX = (byte)(int)((float)*in_RDX - *in_RCX);
  }
  Boxed_Value::Boxed_Value((Boxed_Value *)peVar3,in_stack_ffffffffffffffb8);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }